

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O2

int R_FindSkin(char *name,int pclass)

{
  FPlayerSkin *pFVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  uint skin;
  
  iVar4 = strcasecmp("base",name);
  sVar2 = numskins;
  pFVar1 = skins;
  skin = PlayerClasses.Count;
  if (iVar4 != 0) {
    for (; skin < sVar2; skin = skin + 1) {
      iVar4 = strncasecmp(pFVar1[skin].name,name,0x10);
      if (iVar4 == 0) {
        bVar3 = FPlayerClass::CheckSkin(PlayerClasses.Array + pclass,skin);
        if (!bVar3) {
          return pclass;
        }
        return skin;
      }
    }
  }
  return pclass;
}

Assistant:

int R_FindSkin (const char *name, int pclass)
{
	if (stricmp ("base", name) == 0)
	{
		return pclass;
	}

	for (unsigned i = PlayerClasses.Size(); i < numskins; i++)
	{
		if (strnicmp (skins[i].name, name, 16) == 0)
		{
			if (PlayerClasses[pclass].CheckSkin (i))
				return i;
			else
				return pclass;
		}
	}
	return pclass;
}